

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.cpp
# Opt level: O3

Shader * vera::createShader(Shader *__return_storage_ptr__,string *_fragSrc,string *_vertSrc)

{
  DefaultShaders _type;
  DefaultShaders _type_00;
  string local_58;
  string local_38;
  
  Shader::Shader(__return_storage_ptr__);
  if (_fragSrc->_M_string_length == 0) {
    getDefaultSrc_abi_cxx11_(&local_58,(vera *)0x4,_type);
    getDefaultSrc_abi_cxx11_(&local_38,(vera *)0x3,_type_00);
    Shader::setSource(__return_storage_ptr__,&local_58,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  else {
    if (_vertSrc->_M_string_length != 0) {
      Shader::setSource(__return_storage_ptr__,_fragSrc,_vertSrc);
      return __return_storage_ptr__;
    }
    getDefaultSrc_abi_cxx11_(&local_58,(vera *)0x3,_type);
    Shader::setSource(__return_storage_ptr__,_fragSrc,&local_58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Shader createShader(const std::string& _fragSrc, const std::string& _vertSrc) {
    Shader s;
    // s.addDefine("MODEL_VERTEX_COLOR", "v_color");
    // s.addDefine("MODEL_VERTEX_NORMAL", "v_normal");
    // s.addDefine("MODEL_VERTEX_TEXCOORD", "v_texcoord");
    // s.addDefine("MODEL_VERTEX_TANGENT", "v_tangent");

    if (!_fragSrc.empty() && _vertSrc.empty())
        s.setSource(_fragSrc, getDefaultSrc(VERT_DEFAULT_SCENE));
    else if (_fragSrc.empty())
        s.setSource(getDefaultSrc(FRAG_DEFAULT_SCENE), getDefaultSrc(VERT_DEFAULT_SCENE));
    else
        s.setSource(_fragSrc, _vertSrc);

    return s;
}